

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

FDecalAnimator * __thiscall FDecalLib::FindAnimator(FDecalLib *this,char *name)

{
  FDecalAnimator *pFVar1;
  FDecalAnimator **ppFVar2;
  NameEntry *pNVar3;
  int iVar4;
  ulong uVar5;
  
  pNVar3 = FName::NameData.NameArray;
  ppFVar2 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array;
  uVar5 = (ulong)Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count;
  do {
    if ((int)uVar5 < 1) {
      return (FDecalAnimator *)0x0;
    }
    pFVar1 = ppFVar2[uVar5 - 1];
    uVar5 = uVar5 - 1;
    iVar4 = strcasecmp(name,pNVar3[(pFVar1->Name).Index].Text);
  } while (iVar4 != 0);
  return pFVar1;
}

Assistant:

FDecalAnimator *FDecalLib::FindAnimator (const char *name)
{
	int i;

	for (i = (int)Animators.Size ()-1; i >= 0; --i)
	{
		if (stricmp (name, Animators[i]->Name) == 0)
		{
			return Animators[i];
		}
	}
	return NULL;
}